

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

Result __thiscall
testing::Action<double_(const_char_*,_char_**,___locale_struct_*)>::Perform
          (Action<double_(const_char_*,_char_**,___locale_struct_*)> *this,ArgumentTuple *args)

{
  ActionInterface<double_(const_char_*,_char_**,___locale_struct_*)> *pAVar1;
  FailureReporterInterface *pFVar2;
  Result extraout_XMM0_Qa;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pAVar1 = (this->impl_).value_;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             "You are using DoDefault() inside a composite action like DoAll() or WithArgs().  This is not supported for technical reasons.  Please instead spell out the default action, or assign the default action to an Action variable and use the variable in various places."
             ,"");
  if (pAVar1 == (ActionInterface<double_(const_char_*,_char_**,___locale_struct_*)> *)0x0) {
    pFVar2 = internal::GetFailureReporter();
    (*pFVar2->_vptr_FailureReporterInterface[2])
              (pFVar2,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gmock/gmock.h"
               ,0x4c8,local_40);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  pAVar1 = (this->impl_).value_;
  (*pAVar1->_vptr_ActionInterface[2])(pAVar1,args);
  return extraout_XMM0_Qa;
}

Assistant:

Result Perform(const ArgumentTuple& args) const {
    internal::Assert(
        !IsDoDefault(), __FILE__, __LINE__,
        "You are using DoDefault() inside a composite action like "
        "DoAll() or WithArgs().  This is not supported for technical "
        "reasons.  Please instead spell out the default action, or "
        "assign the default action to an Action variable and use "
        "the variable in various places.");
    return impl_->Perform(args);
  }